

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<CborValue>::relocate
          (QArrayDataPointer<CborValue> *this,qsizetype offset,CborValue **data)

{
  bool bVar1;
  CborValue *first;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  CborValue *res;
  
  first = (CborValue *)(*(long *)(in_RDI + 8) + in_RSI * 0x18);
  QtPrivate::q_relocate_overlap_n<CborValue,long_long>(first,in_RDI,(CborValue *)0x8dd334);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::q_points_into_range<QArrayDataPointer<CborValue>,CborValue_const*>
                        (data,(QArrayDataPointer<CborValue> *)res), bVar1)) {
    *in_RDX = in_RSI * 0x18 + *in_RDX;
  }
  *(CborValue **)(in_RDI + 8) = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }